

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O0

void __thiscall testing::internal::edit_distance::anon_unknown_1::Hunk::FlushEdits(Hunk *this)

{
  int in_ECX;
  __off64_t *in_R8;
  size_t in_R9;
  uint __flags;
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *this_00;
  iterator local_30;
  _List_const_iterator<std::pair<char,_const_char_*>_> local_28;
  iterator local_20;
  _List_const_iterator<std::pair<char,_const_char_*>_> local_18;
  Hunk *local_10;
  Hunk *this_local;
  
  this_00 = &this->hunk_;
  local_10 = this;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::end
                 (&this->hunk_);
  std::_List_const_iterator<std::pair<char,_const_char_*>_>::_List_const_iterator
            (&local_18,&local_20);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::splice(this_00,(int)local_18._M_node,(__off64_t *)&this->hunk_removes_,in_ECX,in_R8,in_R9,
           (uint)this_00);
  __flags = (uint)this_00;
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::end
                 (&this->hunk_);
  std::_List_const_iterator<std::pair<char,_const_char_*>_>::_List_const_iterator
            (&local_28,&local_30);
  std::__cxx11::list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
  ::splice(&this->hunk_,(int)local_28._M_node,(__off64_t *)&this->hunk_adds_,in_ECX,in_R8,in_R9,
           __flags);
  return;
}

Assistant:

void FlushEdits() {
    hunk_.splice(hunk_.end(), hunk_removes_);
    hunk_.splice(hunk_.end(), hunk_adds_);
  }